

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void Intra16Preds_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *top_00;
  uint8_t v;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (top == (uint8_t *)0x0) {
    top_00 = left;
    if (left != (uint8_t *)0x0) goto LAB_00124d32;
    v = 0x80;
  }
  else {
    top_00 = top;
    if (left == (uint8_t *)0x0) {
LAB_00124d32:
      DC16NoLeft_SSE2(dst,top_00);
      goto LAB_00124d46;
    }
    auVar2 = psadbw(*(undefined1 (*) [16])top,(undefined1  [16])0x0);
    auVar1 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])left);
    v = (uint8_t)(auVar2._8_4_ + auVar2._0_4_ + auVar1._8_4_ + auVar1._0_4_ + 0x10U >> 5);
  }
  Put16_SSE2(v,dst);
LAB_00124d46:
  VerticalPred_SSE2(dst + 0x200,top,0x10);
  HorizontalPred_SSE2(dst + 0x210,left,0x10);
  TrueMotion_SSE2(dst + 0x10,left,top,0x10);
  return;
}

Assistant:

static void Intra16Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                              const uint8_t* WEBP_RESTRICT left,
                              const uint8_t* WEBP_RESTRICT top) {
  DC16Mode_SSE2(I16DC16 + dst, left, top);
  VerticalPred_SSE2(I16VE16 + dst, top, 16);
  HorizontalPred_SSE2(I16HE16 + dst, left, 16);
  TrueMotion_SSE2(I16TM16 + dst, left, top, 16);
}